

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O2

int stbi_write_tga_core(stbi__write_context *s,int x,int y,int comp,void *data)

{
  long lVar1;
  uint rgb_dir;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  void *pvVar8;
  undefined4 in_register_00000034;
  int iVar9;
  uchar *d;
  void *__s1;
  size_t __n;
  uint uVar10;
  int iVar11;
  bool bVar12;
  bool bVar13;
  ulong in_stack_fffffffffffffed0;
  undefined8 in_stack_fffffffffffffee8;
  
  rgb_dir = (uint)((comp - 2U & 0xfffffffd) == 0);
  iVar2 = comp - rgb_dir;
  if ((y | x) < 0) {
    iVar2 = 0;
  }
  else if (stbi_write_tga_with_rle == 0) {
    iVar2 = stbiw__outfile(s,rgb_dir,(int)data,x,y,comp,0,data,rgb_dir,0,"111 221 2222 11",0,0,
                           iVar2 < 2 | 2,0,0,0,0,0,x,y,(iVar2 + rgb_dir) * 8,rgb_dir * 8);
  }
  else {
    d = (uchar *)0x0;
    stbiw__writef(s,(char *)CONCAT44(in_register_00000034,x),0,0,(ulong)(iVar2 < 2 | 10),0,0,
                  in_stack_fffffffffffffed0 & 0xffffffff00000000,0,0,
                  CONCAT44((int)((ulong)in_stack_fffffffffffffee8 >> 0x20),x),y,
                  (iVar2 + rgb_dir) * 8,rgb_dir * 8);
    iVar2 = y + -1;
    bVar12 = stbi__flip_vertically_on_write == 0;
    lVar1 = (ulong)(stbi__flip_vertically_on_write != 0) * 2 + -1;
    if (stbi__flip_vertically_on_write != 0) {
      iVar2 = 0;
    }
    iVar9 = comp * x;
    __n = (size_t)comp;
    iVar3 = iVar2 * iVar9;
    for (lVar5 = (long)iVar2; lVar5 != (int)(-(uint)bVar12 | y); lVar5 = lVar5 + lVar1) {
      iVar2 = iVar9 * (int)lVar5;
      for (iVar11 = 0; iVar11 < x; iVar11 = uVar10 + iVar11) {
        uVar10 = 1;
        if (iVar11 < x + -1) {
          __s1 = (void *)((long)data + (long)(iVar11 * comp) + (long)iVar2);
          iVar4 = bcmp(__s1,(void *)((long)data + (long)((iVar11 + 1) * comp) + (long)iVar2),__n);
          lVar6 = (long)(iVar11 + 2);
          if (iVar4 != 0) {
            pvVar8 = (void *)((long)data + __n * lVar6 + (long)iVar3);
            uVar10 = 2;
            while( true ) {
              if ((x <= lVar6) || (0x7f < uVar10)) goto LAB_0010ef6e;
              iVar4 = bcmp(__s1,pvVar8,__n);
              if (iVar4 == 0) break;
              __s1 = (void *)((long)__s1 + __n);
              uVar10 = uVar10 + 1;
              lVar6 = lVar6 + 1;
              pvVar8 = (void *)((long)pvVar8 + __n);
            }
            uVar10 = uVar10 - 1;
            goto LAB_0010ef6e;
          }
          pvVar8 = (void *)((long)data + __n * lVar6 + (long)iVar3);
          uVar10 = 2;
          while (((lVar6 < x && (uVar10 < 0x80)) && (iVar4 = bcmp(__s1,pvVar8,__n), iVar4 == 0))) {
            uVar10 = uVar10 + 1;
            lVar6 = lVar6 + 1;
            pvVar8 = (void *)((long)pvVar8 + __n);
          }
          stbiw__write1(s,(char)uVar10 + '\x7f');
          stbiw__write_pixel(s,comp,rgb_dir,0,(int)__s1,d);
        }
        else {
LAB_0010ef6e:
          stbiw__write1(s,(char)uVar10 + 0xff);
          uVar7 = (ulong)uVar10;
          lVar6 = (long)data + (long)(iVar11 * comp) + (long)iVar3;
          while (bVar13 = uVar7 != 0, uVar7 = uVar7 - 1, bVar13) {
            stbiw__write_pixel(s,comp,rgb_dir,0,(int)lVar6,d);
            lVar6 = lVar6 + __n;
          }
        }
      }
      iVar3 = (int)lVar1 * iVar9 + iVar3;
    }
    stbiw__write_flush(s);
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

static int stbi_write_tga_core(stbi__write_context *s, int x, int y, int comp, void *data)
{
   int has_alpha = (comp == 2 || comp == 4);
   int colorbytes = has_alpha ? comp-1 : comp;
   int format = colorbytes < 2 ? 3 : 2; // 3 color channels (RGB/RGBA) = 2, 1 color channel (Y/YA) = 3

   if (y < 0 || x < 0)
      return 0;

   if (!stbi_write_tga_with_rle) {
      return stbiw__outfile(s, -1, -1, x, y, comp, 0, (void *) data, has_alpha, 0,
         "111 221 2222 11", 0, 0, format, 0, 0, 0, 0, 0, x, y, (colorbytes + has_alpha) * 8, has_alpha * 8);
   } else {
      int i,j,k;
      int jend, jdir;

      stbiw__writef(s, "111 221 2222 11", 0,0,format+8, 0,0,0, 0,0,x,y, (colorbytes + has_alpha) * 8, has_alpha * 8);

      if (stbi__flip_vertically_on_write) {
         j = 0;
         jend = y;
         jdir = 1;
      } else {
         j = y-1;
         jend = -1;
         jdir = -1;
      }
      for (; j != jend; j += jdir) {
         unsigned char *row = (unsigned char *) data + j * x * comp;
         int len;

         for (i = 0; i < x; i += len) {
            unsigned char *begin = row + i * comp;
            int diff = 1;
            len = 1;

            if (i < x - 1) {
               ++len;
               diff = memcmp(begin, row + (i + 1) * comp, comp);
               if (diff) {
                  const unsigned char *prev = begin;
                  for (k = i + 2; k < x && len < 128; ++k) {
                     if (memcmp(prev, row + k * comp, comp)) {
                        prev += comp;
                        ++len;
                     } else {
                        --len;
                        break;
                     }
                  }
               } else {
                  for (k = i + 2; k < x && len < 128; ++k) {
                     if (!memcmp(begin, row + k * comp, comp)) {
                        ++len;
                     } else {
                        break;
                     }
                  }
               }
            }

            if (diff) {
               unsigned char header = STBIW_UCHAR(len - 1);
               stbiw__write1(s, header);
               for (k = 0; k < len; ++k) {
                  stbiw__write_pixel(s, -1, comp, has_alpha, 0, begin + k * comp);
               }
            } else {
               unsigned char header = STBIW_UCHAR(len - 129);
               stbiw__write1(s, header);
               stbiw__write_pixel(s, -1, comp, has_alpha, 0, begin);
            }
         }
      }
      stbiw__write_flush(s);
   }
   return 1;
}